

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAnnotationObjectHelper.cc
# Opt level: O1

string * __thiscall
QPDFAnnotationObjectHelper::getSubtype_abi_cxx11_
          (string *__return_storage_ptr__,QPDFAnnotationObjectHelper *this)

{
  string local_50;
  long *local_30 [2];
  long local_20 [2];
  
  local_50._M_dataplus._M_p =
       (pointer)(this->super_QPDFObjectHelper).super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50._M_string_length =
       (size_type)
       (this->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length)->_M_use_count
           + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length)->_M_use_count
           + 1;
    }
  }
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"/Subtype","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_50.field_2,&local_50);
  QPDFObjectHandle::getName_abi_cxx11_(__return_storage_ptr__,(QPDFObjectHandle *)&local_50.field_2)
  ;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.field_2._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.field_2._8_8_);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFAnnotationObjectHelper::getSubtype()
{
    return oh().getKey("/Subtype").getName();
}